

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_type_traits.hpp
# Opt level: O2

type * __thiscall
jsoncons::
json_type_traits<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,void>
::as<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
          (type *__return_storage_ptr__,
          json_type_traits<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,void>
          *this,basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *j)

{
  bool bVar1;
  size_t __n;
  conv_error *this_00;
  error_category *peVar2;
  iterator this_01;
  const_array_range_type cVar3;
  error_code ec;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> val;
  
  bVar1 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_array
                    ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)this);
  if (bVar1) {
    (__return_storage_ptr__->
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    __n = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::size
                    ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)this);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::reserve(__return_storage_ptr__,__n);
    cVar3 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::array_range
                      ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)this);
    for (this_01 = cVar3.first_._M_current; this_01._M_current != cVar3.last_._M_current._M_current;
        this_01._M_current = this_01._M_current + 0x10) {
      basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::as_string<std::allocator<char>>
                (&val,(basic_json<char,jsoncons::sorted_policy,std::allocator<char>> *)
                      this_01._M_current);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 __return_storage_ptr__,&val);
      std::__cxx11::string::~string((string *)&val);
    }
    return __return_storage_ptr__;
  }
  this_00 = (conv_error *)__cxa_allocate_exception(0x58);
  peVar2 = conv_error_category();
  ec._M_cat = peVar2;
  ec._0_8_ = 4;
  conv_error::conv_error(this_00,ec);
  __cxa_throw(this_00,&conv_error::typeinfo,conv_error::~conv_error);
}

Assistant:

static typename std::enable_if<!ext_traits::is_byte<typename Container::value_type>::value,Container>::type
        as(const Json& j)
        {
            if (j.is_array())
            {
                T result;
                visit_reserve_(typename std::integral_constant<bool, ext_traits::has_reserve<T>::value>::type(),result,j.size());
                for (const auto& item : j.array_range())
                {
                    result.push_back(item.template as<value_type>());
                }

                return result;
            }
            else 
            {
                JSONCONS_THROW(conv_error(conv_errc::not_vector));
            }
        }